

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O1

C_matrix<double> * __thiscall
C_matrix<double>::operator=
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,C_matrix<double> *c)

{
  unsigned_short l;
  double *pdVar1;
  uint uVar2;
  unsigned_short c_00;
  uint uVar3;
  
  if (this != c) {
    if ((c->m_C != this->m_C) || (c->m_L != this->m_L)) {
      resize(this,c->m_L,c->m_C);
    }
    if (0 < this->m_L) {
      uVar2 = 0;
      l = 0;
      do {
        if (0 < this->m_C) {
          uVar3 = 0;
          c_00 = 0;
          do {
            pdVar1 = operator()(c,l,c_00);
            this->m_A[(int)(this->m_C * uVar2 + uVar3)] = *pdVar1;
            c_00 = c_00 + 1;
            uVar3 = (uint)c_00;
          } while ((int)(uint)c_00 < this->m_C);
        }
        l = l + 1;
        uVar2 = (uint)l;
      } while ((int)uVar2 < this->m_L);
    }
  }
  C_matrix(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator= (C_matrix const& c)
{
    if(this==&c)return *this;

    if(c.getNbColumn()!=this->getNbColumn() || c.getNbRow()!=this->getNbRow())
    {
        this->resize(c.getNbRow(),c.getNbColumn());
        //throw "dimension matrix must agree";
    }

    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            this->m_A[getIndex(i,j)] = c(i,j);
        }
    }
    return *this;
}